

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::SetNestedFunc
          (ParseableFunctionInfo *this,FunctionInfo *nestedFunc,uint index,uint32 flags)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionInfoArray pTVar5;
  FunctionInfoArray nested;
  uint32 flags_local;
  uint index_local;
  FunctionInfo *nestedFunc_local;
  ParseableFunctionInfo *this_local;
  
  uVar3 = GetNestedCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7e2,"(index < this->GetNestedCount())",
                                "Trying to write past the nested func array");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pTVar5 = GetNestedFuncArray(this);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=(pTVar5 + index,nestedFunc);
  return;
}

Assistant:

void ParseableFunctionInfo::SetNestedFunc(FunctionInfo* nestedFunc, uint index, uint32 flags)
    {
        AssertMsg(index < this->GetNestedCount(), "Trying to write past the nested func array");

        FunctionInfoArray nested = this->GetNestedFuncArray();
        nested[index] = nestedFunc;
    }